

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_3,bool polish)

{
  type_conflict5 tVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  long lVar6;
  int *piVar7;
  SPxId *pSVar8;
  byte in_CL;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  SPxId leaveId;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  bool instable;
  int cnt;
  int leave;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff278;
  int i;
  undefined7 in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff287;
  undefined1 uVar9;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff294;
  undefined4 in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2ac;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *maxabs_00;
  int in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2f0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff2f8;
  int in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff334;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff338;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff380;
  int in_stack_fffffffffffff384;
  int in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff38c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff390;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff398;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff3a0;
  int local_c24;
  undefined1 local_c20 [80];
  undefined1 local_bd0 [40];
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff458;
  undefined1 local_b80 [80];
  undefined1 local_b30 [31];
  undefined1 in_stack_fffffffffffff4ef;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff4f0;
  int in_stack_fffffffffffff4fc;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff500;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff508;
  undefined1 in_stack_fffffffffffff53f;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff540;
  uint in_stack_fffffffffffff54c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff550;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff558;
  undefined8 local_a90;
  undefined1 local_a88 [40];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5ac;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5b8;
  undefined1 local_a38 [80];
  undefined1 local_9e8 [80];
  undefined1 local_998 [80];
  undefined4 local_948;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_944;
  undefined1 local_8f4 [80];
  undefined1 local_8a4 [80];
  int local_854;
  undefined1 local_850 [80];
  undefined1 local_800 [80];
  undefined1 local_7b0 [80];
  undefined1 local_760 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_710;
  undefined8 local_6c0;
  undefined1 local_6b8 [80];
  undefined1 local_668 [80];
  undefined1 local_618 [80];
  undefined1 local_5c8 [80];
  undefined8 local_578 [13];
  Real local_510;
  undefined1 local_508 [83];
  byte local_4b5;
  int local_4b4;
  int local_4b0;
  Real local_490;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_484;
  undefined1 local_434 [80];
  undefined1 local_3e4 [80];
  undefined1 local_394 [83];
  byte local_341;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_338;
  undefined8 local_320;
  Real *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  undefined8 local_308;
  Real *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined4 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d8;
  undefined1 *local_1d0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  undefined1 *local_1c0;
  undefined4 *local_1b8;
  Real *local_1b0;
  Real *local_1a8;
  undefined8 *local_1a0;
  undefined1 *local_198;
  undefined8 *local_190;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_181;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined1 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  long local_158;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_149;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  int *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  long local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  int *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  int *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_341 = in_CL & 1;
  local_2f0 = local_394;
  local_338 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
  local_2e8 = local_3e4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
  local_2e0 = local_434;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_fffffffffffff278->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5ea92f);
  local_490 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-05);
  local_310 = &local_484;
  local_318 = &local_490;
  local_320 = 0;
  local_1a8 = local_318;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
             (double)in_stack_fffffffffffff288,
             (type *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5ea9b2);
  local_4b0 = -1;
  local_4b4 = 0;
  lVar6 = (**(code **)(*in_RDI + 0x18))();
  local_4b5 = *(byte *)(lVar6 + 0x81c) & 1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_fffffffffffff278->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5eaa06);
  local_510 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-10);
  local_2f8 = local_508;
  local_300 = &local_510;
  local_308 = 0;
  local_1b0 = local_300;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
             (double)in_stack_fffffffffffff288,
             (type *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5eaa89);
  resetTols((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8));
  this_00 = local_338;
  epsilonZero(in_stack_fffffffffffff278);
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff278,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x5eaac4);
  if (tVar1) {
    do {
      local_1c0 = local_3e4;
      local_1c8 = local_338;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      local_578[0] = 0;
      local_198 = local_394;
      local_1a0 = local_578;
      local_190 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                (in_stack_fffffffffffff338,
                 (double)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330));
      local_4b0 = maxDelta(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                           in_stack_fffffffffffff2b0);
      bVar2 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff278,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5eab8f);
      if ((bVar2) || (local_4b0 == -1)) {
        return -1;
      }
      local_2a0 = local_5c8;
      local_2a8 = local_394;
      in_stack_fffffffffffff2bc = local_4b0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      bVar2 = maxShortLeave(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                            in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a0);
      if (!bVar2) {
        local_2d8 = local_618;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_2d0 = local_668;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_6c0 = 0x4059000000000000;
        local_290 = local_760;
        local_298 = local_394;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
        minStability(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
        local_70 = local_6b8;
        local_78 = &local_6c0;
        local_80 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_81,local_80);
        local_68 = local_6b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_58 = local_6b8;
        local_60 = local_80;
        local_50 = local_78;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278,(double *)0x5eada8);
        local_1f0 = local_618;
        local_1f8 = local_6b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
        if ((local_4b5 & 1) == 0) {
          local_270 = local_800;
          local_278 = local_3e4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
          local_4b0 = maxSelect(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                                in_stack_fffffffffffff390,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
        }
        else {
          local_280 = local_7b0;
          local_288 = local_3e4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
          local_4b0 = maxSelect(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                                in_stack_fffffffffffff390,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
        }
        local_854 = 2;
        local_f0 = local_850;
        local_f8 = &local_484;
        local_100 = &local_854;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_101,local_f8);
        local_e8 = local_850;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_d0 = local_850;
        local_d8 = local_f8;
        local_e0 = local_100;
        local_110 = (long)*local_100;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278,(longlong *)0x5eaf82)
        ;
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff278,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x5eaf97);
        if (tVar1) {
          local_4b4 = local_4b4 + 1;
        }
        else {
          local_4b4 = local_4b4 + 2;
        }
      }
      local_260 = local_8a4;
      local_268 = local_394;
      in_stack_fffffffffffff2b8 = local_4b0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      bVar2 = maxReLeave(in_stack_fffffffffffff558,in_stack_fffffffffffff550,
                         in_stack_fffffffffffff54c,in_stack_fffffffffffff540,
                         (bool)in_stack_fffffffffffff53f);
    } while ((bVar2) && (relax(in_stack_fffffffffffff358), local_4b4 < 2));
  }
  else {
    maxabs_00 = local_338;
    epsilonZero(in_stack_fffffffffffff278);
    local_178 = local_8f4;
    local_180 = &local_944;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_181,local_180);
    local_168 = local_8f4;
    local_170 = local_180;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
               (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
    local_160 = local_8f4;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
              ((cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff278,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5eb109);
    if (!tVar1) {
      return -1;
    }
    do {
      local_1d0 = local_3e4;
      local_1d8 = local_338;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      local_948 = 0;
      local_2b0 = local_394;
      local_2b8 = &local_948;
      local_1b8 = local_2b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (long_long_type)in_stack_fffffffffffff278);
      local_4b0 = minDelta(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)maxabs_00);
      bVar2 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff278,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5eb1d2);
      if ((bVar2) || (local_4b0 == -1)) {
        return -1;
      }
      local_250 = local_998;
      local_258 = local_394;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      bVar2 = minShortLeave(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                            in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a0);
      if (!bVar2) {
        local_2c8 = local_9e8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_2c0 = local_a38;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_a90 = 0x4059000000000000;
        local_240 = local_b30;
        local_248 = local_394;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
        minStability(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
        local_b0 = local_a88;
        local_b8 = &local_a90;
        local_c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&stack0xfffffffffffff520;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_c1,local_c0);
        local_a8 = local_a88;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_98 = local_a88;
        local_a0 = local_c0;
        local_90 = local_b8;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278,(double *)0x5eb39f);
        local_200 = local_9e8;
        local_208 = local_a88;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
        if ((local_4b5 & 1) == 0) {
          local_220 = local_bd0;
          local_228 = local_3e4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
          local_4b0 = minSelect(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                                in_stack_fffffffffffff390,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
        }
        else {
          local_230 = local_b80;
          local_238 = local_3e4;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
          local_4b0 = minSelect(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                                in_stack_fffffffffffff390,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff384,in_stack_fffffffffffff380));
        }
        local_c24 = 2;
        local_138 = local_c20;
        local_140 = &local_484;
        local_148 = &local_c24;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_149,local_140);
        local_130 = local_c20;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
        local_118 = local_c20;
        local_120 = local_140;
        local_128 = local_148;
        local_158 = (long)*local_148;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278,(longlong *)0x5eb579)
        ;
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff278,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x5eb58e);
        if (tVar1) {
          local_4b4 = local_4b4 + 1;
        }
        else {
          local_4b4 = local_4b4 + 2;
        }
      }
      local_210 = &stack0xfffffffffffff38c;
      local_218 = local_394;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                 (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
      bVar2 = minReLeave(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                         in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f0,
                         (bool)in_stack_fffffffffffff4ef);
    } while ((bVar2) && (relax(in_stack_fffffffffffff358), local_4b4 < 2));
  }
  if (((local_341 & 1) != 0) && (-1 < local_4b0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
             (int)((ulong)in_stack_fffffffffffff278 >> 0x20));
    if (*(int *)(in_RDI[1] + 0x494) == 1) {
      bVar2 = SPxId::isSPxRowId((SPxId *)&stack0xfffffffffffff384);
      if (bVar2) {
        return -1;
      }
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0x1008));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x5eb6ff);
      if ((iVar3 == iVar4) && (bVar2 = SPxId::isSPxColId((SPxId *)&stack0xfffffffffffff384), bVar2))
      {
        lVar6 = in_RDI[1];
        iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                         (SPxId *)in_stack_fffffffffffff288);
        piVar7 = DataArray<int>::operator[]((DataArray<int> *)(lVar6 + 0x1008),iVar3);
        if (*piVar7 == 0) {
          return -1;
        }
      }
    }
    else if (*(int *)(in_RDI[1] + 0x494) == 2) {
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0x1008));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x5eb7ab);
      i = (int)((ulong)in_stack_fffffffffffff278 >> 0x20);
      if (iVar3 == iVar4) {
        pSVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),i);
        bVar2 = SPxId::isSPxColId(pSVar8);
        if (bVar2) {
          in_stack_fffffffffffff288 =
               (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(in_RDI[1] + 0x1008);
          iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(iVar3,in_stack_fffffffffffff290),
                           (SPxId *)in_stack_fffffffffffff288);
          piVar7 = DataArray<int>::operator[]((DataArray<int> *)in_stack_fffffffffffff288,iVar3);
          if (*piVar7 == 1) {
            return -1;
          }
        }
      }
      else {
        pSVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::baseId((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),i);
        bVar2 = SPxId::isSPxColId(pSVar8);
        if (bVar2) {
          return -1;
        }
      }
    }
  }
  uVar9 = true;
  if (local_4b0 < 0) {
    in_stack_fffffffffffff278 =
         (SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x10);
    (**(code **)(*in_RDI + 0x18))();
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon(in_stack_fffffffffffff288);
    local_28 = &stack0xfffffffffffff334;
    local_30 = (int *)&stack0xfffffffffffff330;
    local_38 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xfffffffffffff2e0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = &stack0xfffffffffffff334;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)CONCAT17(uVar9,in_stack_fffffffffffff280));
    local_8 = &stack0xfffffffffffff334;
    local_10 = local_38;
    local_18 = local_30;
    local_48 = (long)*local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
              ((cpp_dec_float<100U,_int,_void> *)CONCAT17(uVar9,in_stack_fffffffffffff280),
               (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278,(longlong *)0x5eb96d);
    uVar9 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff278,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x5eb97e);
  }
  if ((type_conflict5)uVar9 != false) {
    local_1e0 = local_338;
    local_1e8 = local_434;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)CONCAT17(uVar9,in_stack_fffffffffffff280),
               (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff278);
    if (-1 < local_4b0) {
      tighten(in_stack_fffffffffffff458);
    }
  }
  return local_4b0;
}

Assistant:

int SPxFastRT<R>::selectLeave(R& val, R, bool polish)
{
   R maxabs, max, sel;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int leave = -1;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::ENTER);

   // force instable pivot iff true (see explanation in enter.cpp and spxsolve.hpp)
   bool instable = this->solver()->instableEnter;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableEnterId.isValid());

   resetTols();

   if(val > epsilonZero())
   {
      do
      {
         // phase 1:
         max = val;
         maxabs = 0.0;
         leave = maxDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!maxShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = maxSelect(sel, lowstab, bestDelta, max);
            else
               leave = maxSelect(sel, stab, bestDelta, max);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         max = val;
         maxabs = 0;
         leave = minDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!minShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = minSelect(sel, lowstab, bestDelta, max);
            else
               leave = minSelect(sel, stab, bestDelta, max);

            assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId())
                   || this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                            leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else
      return -1;

   SPX_DEBUG(

      if(leave >= 0)
      std::cout
      << "DFSTRT01 "
      << this->thesolver->basis().iteration() << "("
      << std::setprecision(6) << this->thesolver->value() << ","
      << std::setprecision(2) << this->thesolver->basis().stability() << "):"
      << leave << "\t"
      << std::setprecision(4) << sel << " "
      << std::setprecision(4) << this->thesolver->fVec().delta()[leave] << " "
      << std::setprecision(6) << maxabs
      << std::endl;
      else
         std::cout << "DFSTRT02 " << this->thesolver->basis().iteration()
         << ": skipping instable pivot" << std::endl;
      )

         if(polish && leave >= 0)
         {
            assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
            SPxId leaveId = this->thesolver->baseId(leave);

            // decide whether the chosen leave index contributes to the polishing objective
            if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
            {
               // only allow (integer) variables to leave the basis
               if(leaveId.isSPxRowId())
                  return -1;
               else if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(leaveId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 0)
                     return -1;
               }
            }
            else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
            {
               // only allow slacks and continuous variables to leave the basis
               if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(this->thesolver->baseId(leave).isSPxColId()
                        && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 1)
                     return -1;
               }
               else if(this->thesolver->baseId(leave).isSPxColId())
                  return -1;
            }
         }